

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmTypeLiteral(ExpressionContext *ctx,VmModule *module,ExprTypeLiteral *node)

{
  bool bVar1;
  VmValue *pVVar2;
  byte local_21;
  ExprTypeLiteral *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  bVar1 = isType<TypeFunctionSet>(node->value);
  local_21 = 0;
  if (!bVar1) {
    bVar1 = isType<TypeArgumentSet>(node->value);
    local_21 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeMemberSet>(node->value);
      local_21 = bVar1 ^ 0xff;
    }
  }
  if ((local_21 & 1) == 0) {
    __assert_fail("!isType<TypeFunctionSet>(node->value) && !isType<TypeArgumentSet>(node->value) && !isType<TypeMemberSet>(node->value)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xa0b,
                  "VmValue *CompileVmTypeLiteral(ExpressionContext &, VmModule *, ExprTypeLiteral *)"
                 );
  }
  pVVar2 = anon_unknown.dwarf_aa461::CreateTypeIndex
                     (module,(node->super_ExprBase).source,node->value);
  pVVar2 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar2);
  return pVVar2;
}

Assistant:

VmValue* CompileVmTypeLiteral(ExpressionContext &ctx, VmModule *module, ExprTypeLiteral *node)
{
	assert(!isType<TypeFunctionSet>(node->value) && !isType<TypeArgumentSet>(node->value) && !isType<TypeMemberSet>(node->value));

	return CheckType(ctx, node, CreateTypeIndex(module, node->source, node->value));
}